

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::CheckAndHandlePreMerge(PageHeap *this,Span *span,Span *other)

{
  bool bVar1;
  bool worked;
  Span *other_local;
  Span *span_local;
  PageHeap *this_local;
  
  if (other != (Span *)0x0) {
    if ((((this->aggressive_decommit_ & 1U) == 0) ||
        ((*(uint *)&other->field_0x28 >> 0x18 & 3) != 1)) ||
       ((*(uint *)&span->field_0x28 >> 0x18 & 3) != 2)) {
      if ((*(uint *)&other->field_0x28 >> 0x18 & 3) != (*(uint *)&span->field_0x28 >> 0x18 & 3)) {
        return (Span *)0x0;
      }
    }
    else {
      bVar1 = DecommitSpan(this,other);
      if (!bVar1) {
        return (Span *)0x0;
      }
    }
    RemoveFromFreeList(this,other);
  }
  return other;
}

Assistant:

Span* PageHeap::CheckAndHandlePreMerge(Span* span, Span* other) {
  if (other == nullptr) {
    return other;
  }
  // if we're in aggressive decommit mode and span is decommitted,
  // then we try to decommit adjacent span.
  if (aggressive_decommit_ && other->location == Span::ON_NORMAL_FREELIST
      && span->location == Span::ON_RETURNED_FREELIST) {
    bool worked = DecommitSpan(other);
    if (!worked) {
      return nullptr;
    }
  } else if (other->location != span->location) {
    return nullptr;
  }

  RemoveFromFreeList(other);
  return other;
}